

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939cat.c
# Opt level: O2

int j1939cat_recv_err(j1939cat_priv *priv)

{
  int iVar1;
  size_t sVar2;
  timespec *cur;
  ssize_t sVar3;
  cmsghdr *__cmsg;
  int *piVar4;
  __u32 __errnum;
  int offset;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  sock_extended_err *serr;
  sock_extended_err *psVar9;
  msghdr local_130;
  char control [200];
  
  local_130.msg_name = (void *)0x0;
  local_130.msg_namelen = 0;
  local_130.msg_iov = (iovec *)0x0;
  local_130.msg_iovlen = 0;
  local_130.msg_control = control;
  local_130.msg_controllen = 200;
  local_130.msg_flags = 0;
  sVar3 = recvmsg(priv->sock,&local_130,0x2000);
  if ((int)sVar3 == -1) {
    piVar4 = __errno_location();
    err(1,"recvmsg error notification: %i",*piVar4);
  }
  if ((local_130.msg_flags & 8U) != 0) {
    err(1,"recvmsg error notification: truncated");
  }
  priv->serr = (sock_extended_err *)0x0;
  priv->tss = (scm_timestamping *)0x0;
  __cmsg = (cmsghdr *)local_130.msg_control;
  if (local_130.msg_controllen < 0x10) {
    __cmsg = (cmsghdr *)0x0;
  }
  do {
    if ((__cmsg == (cmsghdr *)0x0) || (sVar2 = __cmsg->cmsg_len, sVar2 == 0)) {
      return 0;
    }
    iVar1 = __cmsg->cmsg_type;
    if (__cmsg->cmsg_level == 0x6b) {
      if (iVar1 != 4) goto LAB_00102cb2;
      psVar9 = (sock_extended_err *)(__cmsg + 1);
      priv->serr = psVar9;
LAB_00102ccd:
      cur = priv->tss->ts;
      if (cur != (timespec *)0x0) {
        if (psVar9->ee_origin == '\x01') {
          switch(psVar9->ee_info) {
          case 1:
            j1939cat_print_timestamp(priv,"TX ABT",cur);
            __errnum = psVar9->ee_errno;
            pcVar7 = strerror(__errnum);
            pcVar8 = "serr: tx error: %i, %s";
            break;
          case 2:
            (priv->stats).tskey = psVar9->ee_data;
            j1939cat_print_timestamp(priv,"RX RTS",cur);
            fprintf(_stderr,
                    "  total size: %u, pgn=0x%05x, sa=0x%02x, da=0x%02x src_name=0x%08lx, dst_name=0x%08lx)\n"
                    ,(ulong)(priv->stats).total,(ulong)(priv->stats).pgn,(ulong)(priv->stats).sa,
                    (ulong)(priv->stats).da,(int)(priv->stats).src_name,(int)(priv->stats).dst_name)
            ;
            priv->last_dpo = -1;
            return 0;
          case 3:
            (priv->stats).tskey = psVar9->ee_data;
            j1939cat_print_timestamp(priv,"RX DPO",cur);
            uVar6 = (priv->stats).send;
            if (priv->last_dpo != 0xffffffff && uVar6 <= (uint)priv->last_dpo) {
              warnx("same dpo? current: %i, last: %i");
              uVar6 = (priv->stats).send;
            }
            priv->last_dpo = uVar6;
            return 0;
          case 4:
            j1939cat_print_timestamp(priv,"RX ABT",cur);
            __errnum = psVar9->ee_errno;
            pcVar7 = strerror(__errnum);
            pcVar8 = "serr: rx error: %i, %s";
            break;
          default:
            warnx("serr: unknown ee_info: %i");
            return -0x5f;
          }
          warnx(pcVar8,__errnum,pcVar7);
          return psVar9->ee_errno;
        }
        if (psVar9->ee_origin == '\x04') {
          if (psVar9->ee_errno != 0x2a) {
            warnx("serr: expected ENOMSG, got: %i");
          }
          (priv->stats).tskey = psVar9->ee_data;
          if ((ulong)psVar9->ee_info < 3) {
            pcVar7 = &DAT_00105290 + *(int *)(&DAT_00105290 + (ulong)psVar9->ee_info * 4);
          }
          else {
            pcVar7 = "   unk";
          }
          j1939cat_print_timestamp(priv,pcVar7,cur);
          return (uint)(psVar9->ee_info != 1) * 4 + -4;
        }
        warnx("serr: wrong origin: %u");
        return 0;
      }
    }
    else {
      if (__cmsg->cmsg_level == 1) {
        if (iVar1 == 0x36) {
          for (uVar5 = 0; (int)uVar5 < (int)sVar2 + -0x10;
              uVar5 = (ulong)((int)uVar5 +
                             (*(ushort *)((long)&__cmsg[1].cmsg_len + uVar5) + 3 & 0xfffffffc))) {
            switch(*(undefined2 *)((long)&__cmsg[1].cmsg_len + uVar5 + 2)) {
            case 1:
              (priv->stats).send = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            case 2:
              (priv->stats).total = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            case 3:
              (priv->stats).pgn = *(uint32_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            case 4:
              (priv->stats).src_name = *(uint64_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            case 5:
              (priv->stats).dst_name = *(uint64_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            case 6:
              (priv->stats).sa = *(uint8_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            case 7:
              (priv->stats).da = *(uint8_t *)((long)&__cmsg[1].cmsg_len + uVar5 + 4);
              break;
            default:
              warnx("not supported J1939_NLA field\n");
            }
          }
        }
        else {
          if (iVar1 != 0x25) goto LAB_00102cb2;
          priv->tss = (scm_timestamping *)(__cmsg + 1);
        }
      }
      else {
LAB_00102cb2:
        warnx("serr: not supported type: %d.%d");
      }
      psVar9 = priv->serr;
      if (psVar9 != (sock_extended_err *)0x0) goto LAB_00102ccd;
    }
    __cmsg = __cmsg_nxthdr(&local_130,__cmsg);
  } while( true );
}

Assistant:

static int j1939cat_recv_err(struct j1939cat_priv *priv)
{
	char control[200];
	struct cmsghdr *cm;
	int ret;
	struct msghdr msg = {
		.msg_control = control,
		.msg_controllen = sizeof(control),
	};

	ret = recvmsg(priv->sock, &msg, MSG_ERRQUEUE);
	if (ret == -1)
		err(EXIT_FAILURE, "recvmsg error notification: %i", errno);
	if (msg.msg_flags & MSG_CTRUNC)
		err(EXIT_FAILURE, "recvmsg error notification: truncated");

	priv->serr = NULL;
	priv->tss = NULL;

	for (cm = CMSG_FIRSTHDR(&msg); cm && cm->cmsg_len;
	     cm = CMSG_NXTHDR(&msg, cm)) {
		j1939cat_parse_cm(priv, cm);
		if (priv->serr && priv->tss)
			return j1939cat_extract_serr(priv);
	}

	return 0;
}